

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t run_delta_filter(rar5 *rar,filter_info *flt)

{
  uint8_t local_31;
  uint8_t byte;
  long lStack_30;
  uint8_t prev_byte;
  ssize_t src_pos;
  ssize_t dest_pos;
  wchar_t i;
  filter_info *flt_local;
  rar5 *rar_local;
  
  lStack_30 = 0;
  for (dest_pos._4_4_ = L'\0'; dest_pos._4_4_ < flt->channels;
      dest_pos._4_4_ = dest_pos._4_4_ + L'\x01') {
    local_31 = '\0';
    for (src_pos = (ssize_t)dest_pos._4_4_; src_pos < flt->block_length;
        src_pos = flt->channels + src_pos) {
      local_31 = local_31 -
                 (rar->cstate).window_buf
                 [(rar->cstate).solid_offset + flt->block_start + lStack_30 &
                  (rar->cstate).window_mask];
      (rar->cstate).filtered_buf[src_pos] = local_31;
      lStack_30 = lStack_30 + 1;
    }
  }
  return L'\0';
}

Assistant:

static int run_delta_filter(struct rar5* rar, struct filter_info* flt) {
	int i;
	ssize_t dest_pos, src_pos = 0;

	for(i = 0; i < flt->channels; i++) {
		uint8_t prev_byte = 0;
		for(dest_pos = i;
				dest_pos < flt->block_length;
				dest_pos += flt->channels)
		{
			uint8_t byte;

			byte = rar->cstate.window_buf[
			    (rar->cstate.solid_offset + flt->block_start +
			    src_pos) & rar->cstate.window_mask];

			prev_byte -= byte;
			rar->cstate.filtered_buf[dest_pos] = prev_byte;
			src_pos++;
		}
	}

	return ARCHIVE_OK;
}